

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_suppression_impl.cc
# Opt level: O2

void __thiscall
webrtc::NoiseSuppressionImpl::Initialize
          (NoiseSuppressionImpl *this,size_t channels,int sample_rate_hz)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  Suppressor *this_00;
  long lVar4;
  bool bVar5;
  vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  local_58;
  CritScope cs;
  
  rtc::CritScope::CritScope(&cs,this->crit_);
  this->channels_ = channels;
  this->sample_rate_hz_ = sample_rate_hz;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->enabled_ == true) {
    std::
    vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
    ::resize(&local_58,channels);
    lVar4 = 0;
    while( true ) {
      puVar1 = local_58.
               super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = channels == 0;
      channels = channels - 1;
      if (bVar5) break;
      this_00 = (Suppressor *)operator_new(8);
      Suppressor::Suppressor(this_00,sample_rate_hz);
      std::
      __uniq_ptr_impl<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
      ::reset((__uniq_ptr_impl<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
               *)((long)&(puVar1->_M_t).
                         super___uniq_ptr_impl<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_webrtc::NoiseSuppressionImpl::Suppressor_*,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>
                         .super__Head_base<0UL,_webrtc::NoiseSuppressionImpl::Suppressor_*,_false>.
                         _M_head_impl + lVar4),this_00);
      lVar4 = lVar4 + 8;
    }
  }
  else {
    local_58.
    super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  puVar1 = (this->suppressors_).
           super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar2 = (this->suppressors_).
           super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->suppressors_).
           super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->suppressors_).
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(undefined4 *)
   &(this->suppressors_).
    super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  *(undefined4 *)
   ((long)&(this->suppressors_).
           super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) =
       local_58.
       super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  *(undefined4 *)
   &(this->suppressors_).
    super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
  *(undefined4 *)
   ((long)&(this->suppressors_).
           super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
       local_58.
       super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = puVar2;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar3;
  local_58.
  super__Vector_base<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar1;
  (*(this->super_NoiseSuppression)._vptr_NoiseSuppression[2])(this,(ulong)this->level_);
  std::
  vector<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>,_std::allocator<std::unique_ptr<webrtc::NoiseSuppressionImpl::Suppressor,_std::default_delete<webrtc::NoiseSuppressionImpl::Suppressor>_>_>_>
  ::~vector(&local_58);
  rtc::CritScope::~CritScope(&cs);
  return;
}

Assistant:

void NoiseSuppressionImpl::Initialize(size_t channels, int sample_rate_hz) {
  rtc::CritScope cs(crit_);
  channels_ = channels;
  sample_rate_hz_ = sample_rate_hz;
  std::vector<std::unique_ptr<Suppressor>> new_suppressors;
  if (enabled_) {
    new_suppressors.resize(channels);
    for (size_t i = 0; i < channels; i++) {
      new_suppressors[i].reset(new Suppressor(sample_rate_hz));
    }
  }
  suppressors_.swap(new_suppressors);
  set_level(level_);
}